

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

void __thiscall LiteScript::String::String(String *this,char c)

{
  undefined3 in_register_00000031;
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&this->str,CONCAT31(in_register_00000031,c));
  return;
}

Assistant:

LiteScript::String::String(char c) { this->str += (char32_t)c; }